

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.h
# Opt level: O0

void __thiscall cv::Mat::release(Mat *this)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RDI;
  
  if (in_RDI[1] != 0) {
    piVar2 = (int *)in_RDI[1];
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      ncnn::fastFree((void *)0x156a78);
    }
  }
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  in_RDI[1] = 0;
  return;
}

Assistant:

void release()
    {
        if (refcount && NCNN_XADD(refcount, -1) == 1)
            ncnn::fastFree(data);

        data = 0;

        rows = 0;
        cols = 0;
        c = 0;

        refcount = 0;
    }